

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_add_hl_hl_half_carry_Test::~CpuTest_add_hl_hl_half_carry_Test
          (CpuTest_add_hl_hl_half_carry_Test *this)

{
  CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_hl_half_carry) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 0x8;
    regs.l = 0xFF;
    execute_instruction(0x29);

    ICpu::Registers expected_regs{};
    expected_regs.h = 0x11;
    expected_regs.l = 0xFE;
    expected_regs.f = ICpu::Z_FLAG | ICpu::H_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}